

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargetingAQModeOnOffCBRTest
          (DatarateTestLarge *this)

{
  undefined1 uVar1;
  bool bVar2;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var3;
  Message *message;
  long in_RDI;
  Message *message_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffea4;
  double *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  int iVar6;
  Message *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  HasNewFatalFailureHelper *this_00;
  uint in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  AssertionResult local_108 [2];
  Message *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  HasNewFatalFailureHelper local_b8;
  undefined1 local_89 [33];
  undefined1 local_68 [104];
  
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var3 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x785ca9);
  if (0 < *p_Var3) {
    return;
  }
  *(undefined4 *)(in_RDI + 0xd0) = 500;
  *(undefined4 *)(in_RDI + 0xd4) = 500;
  *(undefined4 *)(in_RDI + 0xcc) = 1000;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0xbc) = 2;
  *(undefined4 *)(in_RDI + 0xc0) = 0x3f;
  *(undefined4 *)(in_RDI + 0x90) = 1;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 1;
  *(undefined4 *)(in_RDI + 0xe8) = 0;
  this_00 = (HasNewFatalFailureHelper *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_89 + 1),"pixel_capture_w320h240.yuv",(allocator *)this_00);
  uVar5 = 0x136;
  uVar4 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)this_00,
             (string *)
             CONCAT17(in_stack_fffffffffffffecf,
                      CONCAT16(in_stack_fffffffffffffece,
                               CONCAT24(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))),
             (uint)((ulong)in_stack_fffffffffffffec0 >> 0x20),(uint)in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  *(undefined4 *)(in_RDI + 0xb8) = 0x3c;
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x98))(in_RDI + 0x18);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(this_00);
    in_stack_fffffffffffffece = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffece) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_b8);
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffea4,uVar5));
    if (!bVar2) {
      message_00 = (Message *)((double)*(uint *)(in_RDI + 0xb8) * 0.85);
      testing::internal::CmpHelperGE<double,double>
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (double *)CONCAT44(in_stack_fffffffffffffea4,uVar5));
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff20);
      if (!bVar2) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffffec0 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffea4,uVar5),
                        (char (*) [61])CONCAT44(in_stack_fffffffffffffe9c,uVar4));
        in_stack_fffffffffffffeb8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x786073);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,
                   CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffece,in_stack_fffffffffffffecc)),
                   (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                   ,in_stack_fffffffffffffeb0);
        testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,message_00);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffea4,uVar5));
        testing::Message::~Message((Message *)0x7860c1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x786142);
      if (bVar2) {
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                   (double *)CONCAT44(in_stack_fffffffffffffea4,uVar5));
        iVar6 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(local_108);
        if (!bVar2) {
          testing::Message::Message((Message *)this_00);
          message = testing::Message::operator<<
                              ((Message *)CONCAT44(in_stack_fffffffffffffea4,uVar5),
                               (char (*) [63])CONCAT44(in_stack_fffffffffffffe9c,uVar4));
          testing::AssertionResult::failure_message((AssertionResult *)0x7861f3);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,
                     CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffece,in_stack_fffffffffffffecc)),
                     (char *)in_stack_fffffffffffffec0,iVar6,(char *)message);
          testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,message_00);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffea4,uVar5));
          testing::Message::~Message((Message *)0x786241);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7862bc);
      }
      goto LAB_007862d4;
    }
    if (!bVar2) goto LAB_007862d4;
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  testing::Message::Message((Message *)this_00);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffece,in_stack_fffffffffffffecc)),
             (char *)in_stack_fffffffffffffec0,iVar6,in_stack_fffffffffffffeb0);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffea4,uVar5));
  testing::Message::~Message((Message *)0x785f7d);
LAB_007862d4:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7862e1);
  return;
}

Assistant:

virtual void BasicRateTargetingAQModeOnOffCBRTest() {
    if (GET_PARAM(4) > 0) return;
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 2;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    cfg_.g_pass = AOM_RC_ONE_PASS;
    cfg_.g_usage = AOM_USAGE_REALTIME;
    cfg_.kf_mode = AOM_KF_DISABLED;

    ::libaom_test::I420VideoSource video("pixel_capture_w320h240.yuv", 320, 240,
                                         30, 1, 0, 310);
    cfg_.rc_target_bitrate = 60;
    ResetModel();
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(effective_datarate_, cfg_.rc_target_bitrate * 0.85)
        << " The datarate for the file is lower than target by too much!";
    ASSERT_LE(effective_datarate_, cfg_.rc_target_bitrate * 1.15)
        << " The datarate for the file is greater than target by too much!";
  }